

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

void ctl_arena_refresh(tsdn_t *tsdn,arena_t *arena,ctl_arena_t *ctl_sdarena,uint i,_Bool destroyed)

{
  pa_shard_stats_t *ppVar1;
  pac_stats_t *ppVar2;
  locked_u64_t *plVar3;
  pac_decay_stats_t *ppVar4;
  size_t *psVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  ctl_arena_stats_t *pcVar9;
  long lVar10;
  long lVar11;
  ctl_arena_t *pcVar12;
  size_t sVar13;
  uint64_t uVar14;
  size_t *psVar15;
  long lVar16;
  ctl_arena_stats_t *pcVar17;
  mutex_prof_data_t *data;
  mutex_prof_data_t *sum;
  bool bVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  
  pcVar12 = arenas_i((ulong)i);
  pcVar12->nthreads = 0;
  pcVar12->dss = "N/A";
  *(undefined4 *)&pcVar12->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar12->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&pcVar12->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar12->muzzy_decay_ms + 4) = 0xffffffff;
  pcVar12->pactive = 0;
  pcVar12->pdirty = 0;
  pcVar12->pmuzzy = 0;
  switchD_014c69ad::default(pcVar12->astats,0,0x9818);
  pcVar9 = pcVar12->astats;
  duckdb_je_arena_stats_merge
            (tsdn,arena,&pcVar12->nthreads,&pcVar12->dss,&pcVar12->dirty_decay_ms,
             &pcVar12->muzzy_decay_ms,&pcVar12->pactive,&pcVar12->pdirty,&pcVar12->pmuzzy,
             &pcVar9->astats,pcVar9->bstats,pcVar9->lstats,pcVar9->estats,&pcVar9->hpastats,
             &pcVar9->secstats);
  pcVar9 = pcVar12->astats;
  sVar13 = pcVar9->allocated_small;
  uVar19 = pcVar9->nmalloc_small;
  uVar20 = pcVar9->ndalloc_small;
  uVar14 = pcVar9->nrequests_small;
  uVar21 = pcVar9->nfills_small;
  uVar22 = pcVar9->nflushes_small;
  psVar15 = duckdb_je_sz_index2size_tab;
  for (lVar16 = 0x51c; lVar16 != 0x834; lVar16 = lVar16 + 0x16) {
    sVar13 = sVar13 + *psVar15 * *(long *)((long)pcVar9 + lVar16 * 8 + -8);
    pcVar9->allocated_small = sVar13;
    plVar6 = (long *)((long)pcVar9 + lVar16 * 8 + -0x20);
    uVar19 = uVar19 + *plVar6;
    uVar20 = uVar20 + plVar6[1];
    pcVar9->nmalloc_small = uVar19;
    pcVar9->ndalloc_small = uVar20;
    uVar14 = uVar14 + *(long *)((long)pcVar9 + lVar16 * 8 + -0x10);
    pcVar9->nrequests_small = uVar14;
    psVar5 = &(pcVar9->astats).base + lVar16;
    uVar21 = uVar21 + *psVar5;
    uVar22 = uVar22 + psVar5[1];
    pcVar9->nfills_small = uVar21;
    pcVar9->nflushes_small = uVar22;
    psVar15 = psVar15 + 1;
  }
  if (destroyed) {
    pcVar17 = ctl_sdarena->astats;
  }
  else {
    ctl_sdarena->nthreads = ctl_sdarena->nthreads + pcVar12->nthreads;
    sVar13 = pcVar12->pdirty;
    ctl_sdarena->pactive = ctl_sdarena->pactive + pcVar12->pactive;
    ctl_sdarena->pdirty = ctl_sdarena->pdirty + sVar13;
    ctl_sdarena->pmuzzy = ctl_sdarena->pmuzzy + pcVar12->pmuzzy;
    pcVar17 = ctl_sdarena->astats;
    psVar15 = &(pcVar17->astats).mapped;
    *psVar15 = *psVar15 + (pcVar9->astats).mapped;
    psVar15 = &(pcVar17->astats).pa_shard_stats.pac_stats.retained;
    *psVar15 = *psVar15 + (pcVar9->astats).pa_shard_stats.pac_stats.retained;
    ppVar1 = &(pcVar17->astats).pa_shard_stats;
    ppVar1->edata_avail = ppVar1->edata_avail + (pcVar9->astats).pa_shard_stats.edata_avail;
  }
  ppVar2 = &(pcVar17->astats).pa_shard_stats.pac_stats;
  (ppVar2->decay_dirty).npurge.val.repr =
       (ppVar2->decay_dirty).npurge.val.repr +
       (pcVar9->astats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr;
  plVar3 = &(pcVar17->astats).pa_shard_stats.pac_stats.decay_dirty.nmadvise;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar9->astats).pa_shard_stats.pac_stats.decay_dirty.nmadvise.val.repr;
  plVar3 = &(pcVar17->astats).pa_shard_stats.pac_stats.decay_dirty.purged;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar9->astats).pa_shard_stats.pac_stats.decay_dirty.purged.val.repr;
  ppVar4 = &(pcVar17->astats).pa_shard_stats.pac_stats.decay_muzzy;
  (ppVar4->npurge).val.repr =
       (ppVar4->npurge).val.repr +
       (pcVar9->astats).pa_shard_stats.pac_stats.decay_muzzy.npurge.val.repr;
  plVar3 = &(pcVar17->astats).pa_shard_stats.pac_stats.decay_muzzy.nmadvise;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar9->astats).pa_shard_stats.pac_stats.decay_muzzy.nmadvise.val.repr;
  plVar3 = &(pcVar17->astats).pa_shard_stats.pac_stats.decay_muzzy.purged;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar9->astats).pa_shard_stats.pac_stats.decay_muzzy.purged.val.repr;
  malloc_mutex_prof_merge((pcVar17->astats).mutex_prof_data,(pcVar9->astats).mutex_prof_data);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 1,(pcVar9->astats).mutex_prof_data + 1);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 2,(pcVar9->astats).mutex_prof_data + 2);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 3,(pcVar9->astats).mutex_prof_data + 3);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 4,(pcVar9->astats).mutex_prof_data + 4);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 5,(pcVar9->astats).mutex_prof_data + 5);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 6,(pcVar9->astats).mutex_prof_data + 6);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 7,(pcVar9->astats).mutex_prof_data + 7);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 8,(pcVar9->astats).mutex_prof_data + 8);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 9,(pcVar9->astats).mutex_prof_data + 9);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 10,(pcVar9->astats).mutex_prof_data + 10);
  malloc_mutex_prof_merge
            ((pcVar17->astats).mutex_prof_data + 0xb,(pcVar9->astats).mutex_prof_data + 0xb);
  if (!destroyed) {
    sVar13 = (pcVar9->astats).metadata_edata;
    (pcVar17->astats).base = (pcVar17->astats).base + (pcVar9->astats).base;
    (pcVar17->astats).metadata_edata = (pcVar17->astats).metadata_edata + sVar13;
    sVar13 = (pcVar9->astats).resident;
    (pcVar17->astats).metadata_rtree =
         (pcVar9->astats).metadata_rtree + (pcVar17->astats).metadata_rtree;
    (pcVar17->astats).resident = sVar13 + (pcVar17->astats).resident;
    psVar15 = &(pcVar17->astats).metadata_thp;
    *psVar15 = *psVar15 + (pcVar9->astats).metadata_thp;
    (pcVar17->astats).internal.repr =
         (pcVar9->astats).internal.repr + (pcVar17->astats).internal.repr;
    pcVar17->allocated_small = pcVar17->allocated_small + pcVar9->allocated_small;
  }
  uVar14 = pcVar9->ndalloc_small;
  pcVar17->nmalloc_small = pcVar17->nmalloc_small + pcVar9->nmalloc_small;
  pcVar17->ndalloc_small = pcVar17->ndalloc_small + uVar14;
  uVar14 = pcVar9->nfills_small;
  pcVar17->nrequests_small = pcVar9->nrequests_small + pcVar17->nrequests_small;
  pcVar17->nfills_small = uVar14 + pcVar17->nfills_small;
  pcVar17->nflushes_small = pcVar17->nflushes_small + pcVar9->nflushes_small;
  if (!destroyed) {
    psVar15 = &(pcVar17->astats).allocated_large;
    *psVar15 = *psVar15 + (pcVar9->astats).allocated_large;
  }
  uVar14 = (pcVar9->astats).ndalloc_large;
  (pcVar17->astats).nmalloc_large = (pcVar17->astats).nmalloc_large + (pcVar9->astats).nmalloc_large
  ;
  (pcVar17->astats).ndalloc_large = (pcVar17->astats).ndalloc_large + uVar14;
  uVar14 = (pcVar9->astats).nrequests_large;
  (pcVar17->astats).nflushes_large =
       (pcVar9->astats).nflushes_large + (pcVar17->astats).nflushes_large;
  (pcVar17->astats).nrequests_large = uVar14 + (pcVar17->astats).nrequests_large;
  (pcVar17->astats).pa_shard_stats.pac_stats.abandoned_vm.repr =
       (pcVar9->astats).pa_shard_stats.pac_stats.abandoned_vm.repr +
       (pcVar17->astats).pa_shard_stats.pac_stats.abandoned_vm.repr;
  sVar13 = (pcVar9->astats).tcache_stashed_bytes;
  (pcVar17->astats).tcache_bytes = (pcVar17->astats).tcache_bytes + (pcVar9->astats).tcache_bytes;
  (pcVar17->astats).tcache_stashed_bytes = (pcVar17->astats).tcache_stashed_bytes + sVar13;
  if (pcVar12->arena_ind == 0) {
    (pcVar17->astats).uptime.ns = (pcVar9->astats).uptime.ns;
  }
  sum = &pcVar17->bstats[0].mutex_data;
  data = &pcVar9->bstats[0].mutex_data;
  lVar16 = 0x24;
  while( true ) {
    bVar18 = lVar16 == 0;
    lVar16 = lVar16 + -1;
    if (bVar18) break;
    uVar14 = data[-2].n_spin_acquired;
    sum[-2].n_wait_times = sum[-2].n_wait_times + data[-2].n_wait_times;
    sum[-2].n_spin_acquired = sum[-2].n_spin_acquired + uVar14;
    *(long *)&sum[-2].max_n_thds = *(long *)&sum[-2].max_n_thds + *(long *)&data[-2].max_n_thds;
    if (!destroyed) {
      sum[-2].n_owner_switches = sum[-2].n_owner_switches + data[-2].n_owner_switches;
    }
    uVar14 = data[-2].n_lock_ops;
    uVar19 = sum[-1].tot_wait_time.ns;
    uVar20 = sum[-1].max_wait_time.ns;
    sum[-2].prev_owner =
         (tsdn_t *)
         (&((sum[-2].prev_owner)->tsd).
           cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
         (long)&((data[-2].prev_owner)->tsd).
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled);
    sum[-2].n_lock_ops = sum[-2].n_lock_ops + uVar14;
    uVar14 = data[-1].max_wait_time.ns;
    sum[-1].tot_wait_time.ns = data[-1].tot_wait_time.ns + uVar19;
    sum[-1].max_wait_time.ns = uVar14 + uVar20;
    if (!destroyed) {
      uVar14 = data[-1].n_spin_acquired;
      sum[-1].n_wait_times = sum[-1].n_wait_times + data[-1].n_wait_times;
      sum[-1].n_spin_acquired = sum[-1].n_spin_acquired + uVar14;
    }
    uVar14 = data[-1].n_owner_switches;
    *(long *)&sum[-1].max_n_thds = *(long *)&sum[-1].max_n_thds + *(long *)&data[-1].max_n_thds;
    sum[-1].n_owner_switches = sum[-1].n_owner_switches + uVar14;
    uVar14 = data[-1].n_lock_ops;
    sum[-1].prev_owner =
         (tsdn_t *)
         (&((data[-1].prev_owner)->tsd).
           cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
         (long)&((sum[-1].prev_owner)->tsd).
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled);
    sum[-1].n_lock_ops = uVar14 + sum[-1].n_lock_ops;
    malloc_mutex_prof_merge(sum,data);
    sum = (mutex_prof_data_t *)&sum[2].prev_owner;
    data = (mutex_prof_data_t *)&data[2].prev_owner;
  }
  for (lVar16 = 0; lVar16 != 0x24c0; lVar16 = lVar16 + 0x30) {
    plVar6 = (long *)((long)&pcVar17->lstats[0].nmalloc.val.repr + lVar16);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar9->lstats[0].nmalloc.val.repr + lVar16);
    plVar6 = (long *)((long)&pcVar17->lstats[0].ndalloc.val.repr + lVar16);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar9->lstats[0].ndalloc.val.repr + lVar16);
    plVar6 = (long *)((long)&pcVar17->lstats[0].nrequests.val.repr + lVar16);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar9->lstats[0].nrequests.val.repr + lVar16);
    if (!destroyed) {
      plVar6 = (long *)((long)&pcVar17->lstats[0].curlextents + lVar16);
      *plVar6 = *plVar6 + *(long *)((long)&pcVar9->lstats[0].curlextents + lVar16);
    }
  }
  for (lVar16 = 0; lVar16 != 0x2550; lVar16 = lVar16 + 0x30) {
    plVar6 = (long *)((long)&pcVar17->estats[0].nmuzzy + lVar16);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar9->estats[0].nmuzzy + lVar16);
    plVar6 = (long *)((long)&pcVar17->estats[0].nretained + lVar16);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar9->estats[0].nretained + lVar16);
    plVar6 = (long *)((long)&pcVar9->estats[0].ndirty + lVar16);
    lVar10 = plVar6[1];
    plVar7 = (long *)((long)&pcVar17->estats[0].ndirty + lVar16);
    lVar11 = plVar7[1];
    plVar8 = (long *)((long)&pcVar17->estats[0].ndirty + lVar16);
    *plVar8 = *plVar7 + *plVar6;
    plVar8[1] = lVar11 + lVar10;
    plVar6 = (long *)((long)&pcVar17->estats[0].muzzy_bytes + lVar16);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar9->estats[0].muzzy_bytes + lVar16);
    plVar6 = (long *)((long)&pcVar17->estats[0].retained_bytes + lVar16);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar9->estats[0].retained_bytes + lVar16);
  }
  duckdb_je_hpa_shard_stats_accum(&pcVar17->hpastats,&pcVar9->hpastats);
  (pcVar17->secstats).bytes = (pcVar17->secstats).bytes + (pcVar9->secstats).bytes;
  return;
}

Assistant:

static void
ctl_arena_refresh(tsdn_t *tsdn, arena_t *arena, ctl_arena_t *ctl_sdarena,
    unsigned i, bool destroyed) {
	ctl_arena_t *ctl_arena = arenas_i(i);

	ctl_arena_clear(ctl_arena);
	ctl_arena_stats_amerge(tsdn, ctl_arena, arena);
	/* Merge into sum stats as well. */
	ctl_arena_stats_sdmerge(ctl_sdarena, ctl_arena, destroyed);
}